

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void rotateParams(void)

{
  unkuint9 Var1;
  unkuint9 Var2;
  int param;
  long lVar3;
  size_t sVar4;
  int phi_i;
  ulong uVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float newParams [9];
  float local_48 [10];
  
  local_48[8] = 0.0;
  local_48[4] = 0.0;
  local_48[5] = 0.0;
  local_48[6] = 0.0;
  local_48[7] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  Var1 = (unkuint9)phi_n;
  Var2 = (unkuint9)theta_n;
  iVar7 = 0;
  sVar4 = phi_n;
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
    iVar6 = 0;
    for (uVar5 = 0; uVar5 <= sVar4; uVar5 = uVar5 + 1) {
      fVar8 = sinf(((float)(int)uVar5 * 3.1415927) / (float)sVar4);
      for (sVar4 = 0; theta_n != sVar4; sVar4 = sVar4 + 1) {
        local_48[lVar3] =
             legendre_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)(iVar6 + iVar7) + sVar4] *
             shape_scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[(long)iVar6 + sVar4 + 1] *
             (3.1415927 / (float)(unkint9)Var1) * (6.2831855 / (float)(unkint9)Var2) * fVar8 +
             local_48[lVar3];
      }
      iVar6 = iVar6 + (int)theta_n + 1;
      sVar4 = phi_n;
    }
    iVar7 = iVar6 + iVar7;
  }
  for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 4) {
    *(float *)((long)legendre_params + lVar3) = *(float *)((long)local_48 + lVar3) * 3.1415927;
  }
  regenerateBuffer();
  return;
}

Assistant:

void rotateParams() {
    Perf stat("Rotate params");
    float newParams[9] = {0,0,0,0,0,0,0,0,0};

    int baseIndex = 0;
    float d_phi = float(M_PI) / phi_n;
    float d_theta = 2 * float(M_PI) / theta_n;
    for (int param = 0; param < 9; param++) {
        int shapeIndex = 0;
        for (int phi_i = 0; phi_i <= phi_n; phi_i++) {
            float sin_phi = sin(float(M_PI) * phi_i / phi_n);
            for (int theta_i = 0; theta_i < theta_n; theta_i++) {
                float integrand = legendre_scalars[baseIndex + shapeIndex + theta_i] * shape_scalars[shapeIndex + theta_i + 1]; // doesn't overflow because there's an extra on the end
                newParams[param] += integrand * d_phi * d_theta * sin_phi;
            }
            shapeIndex += theta_n + 1;
        }
        baseIndex += shapeIndex;
    }

    for (int c = 0; c < 9; c++) {
        legendre_params[c] = newParams[c] * M_PI; // For some reason it's off by a factor of M_PI. TODO: figure out why
    }

    regenerateBuffer();
}